

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelwithmem.h
# Opt level: O2

void __thiscall
TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_>::TPZCompElWithMem
          (TPZCompElWithMem<TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>_> *this)

{
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZSavable_0176d5c0;
  TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::TPZMultiphysicsCompEl
            (&this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>,&PTR_PTR_0176cba0);
  *(undefined ***)
   &(this->super_TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>).super_TPZMultiphysicsElement.
    super_TPZCompEl = &PTR__TPZCompElWithMem_0176c890;
  TPZStack<long,_128>::TPZStack(&this->fIntPtIndices);
  return;
}

Assistant:

TPZCompElWithMem<TBASE>::TPZCompElWithMem() : TPZRegisterClassId(&TPZCompElWithMem::ClassId),
TBASE() {
    //PrepareIntPtIndices();
}